

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_sendf(connectdata *conn,char *fmt,...)

{
  char in_AL;
  int iVar1;
  char *fmt_00;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_108 [16];
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined1 local_58 [8];
  va_list ap;
  char *taggedfmt;
  imap_conn *imapc;
  CURLcode result;
  char *fmt_local;
  connectdata *conn_local;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  (conn->proto).imapc.cmdid = ((conn->proto).imapc.cmdid + 1) % 1000;
  local_f8 = in_RDX;
  local_f0 = in_RCX;
  local_e8 = in_R8;
  local_e0 = in_R9;
  iVar1 = curlx_sltosi(conn->connection_id % 0x1a);
  curl_msnprintf(&(conn->proto).ftpc.transfertype,5,"%c%03d",(ulong)(iVar1 + 0x41),
                 (ulong)(uint)(conn->proto).imapc.cmdid);
  fmt_00 = curl_maprintf("%s %s",(undefined1 *)((long)&conn->proto + 0xa0),fmt);
  if (fmt_00 == (char *)0x0) {
    conn_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    ap[0].overflow_arg_area = local_108;
    ap[0]._0_8_ = &stack0x00000008;
    local_58._4_4_ = 0x30;
    local_58._0_4_ = 0x10;
    conn_local._4_4_ = Curl_pp_vsendf(&(conn->proto).ftpc.pp,fmt_00,(__va_list_tag *)local_58);
    (*Curl_cfree)(fmt_00);
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode imap_sendf(struct connectdata *conn, const char *fmt, ...)
{
  CURLcode result = CURLE_OK;
  struct imap_conn *imapc = &conn->proto.imapc;
  char *taggedfmt;
  va_list ap;

  DEBUGASSERT(fmt);

  /* Calculate the next command ID wrapping at 3 digits */
  imapc->cmdid = (imapc->cmdid + 1) % 1000;

  /* Calculate the tag based on the connection ID and command ID */
  snprintf(imapc->resptag, sizeof(imapc->resptag), "%c%03d",
           'A' + curlx_sltosi(conn->connection_id % 26), imapc->cmdid);

  /* Prefix the format with the tag */
  taggedfmt = aprintf("%s %s", imapc->resptag, fmt);
  if(!taggedfmt)
    return CURLE_OUT_OF_MEMORY;

  /* Send the data with the tag */
  va_start(ap, fmt);
  result = Curl_pp_vsendf(&imapc->pp, taggedfmt, ap);
  va_end(ap);

  free(taggedfmt);

  return result;
}